

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O1

void bn_mont_reduction_u64(uint32_t len,uint64_t *n,uint64_t nInv,uint64_t *c,uint64_t *res)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  size_t __n;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint64_t *os;
  ulong uVar20;
  ulong uVar21;
  undefined4 in_register_0000003c;
  uint64_t *puVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t *puVar25;
  void *__s;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  undefined8 uStack_70;
  ulong uStack_68;
  uint64_t *local_60;
  ulong local_58;
  uint64_t *local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_0000003c,len);
  uVar26 = (ulong)len;
  if (len == 0) {
    local_38 = 0;
  }
  else {
    local_60 = c + uVar26;
    local_58 = (ulong)(len & 0xfffffffc);
    puVar22 = c + 3;
    uVar24 = 0;
    bVar28 = false;
    puVar25 = c;
    do {
      uVar21 = c[uVar24] * nInv;
      if (len < 4) {
        uVar20 = 0;
      }
      else {
        lVar27 = 0;
        uVar20 = 0;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar20;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar21;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)((long)n + lVar27);
          auVar12 = auVar2 * auVar7 + auVar12;
          uVar23 = auVar12._0_8_;
          puVar1 = (ulong *)((long)puVar22 + lVar27 + -0x18);
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar23;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = auVar12._8_8_ + (ulong)CARRY8(uVar20,uVar23);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar21;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)((long)n + lVar27 + 8);
          auVar13 = auVar3 * auVar8 + auVar13;
          uVar23 = auVar13._0_8_;
          puVar1 = (ulong *)((long)puVar22 + lVar27 + -0x10);
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar23;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = auVar13._8_8_ + (ulong)CARRY8(uVar20,uVar23);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar21;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)((long)n + lVar27 + 0x10);
          auVar14 = auVar4 * auVar9 + auVar14;
          uVar23 = auVar14._0_8_;
          puVar1 = (ulong *)((long)puVar22 + lVar27 + -8);
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar23;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = auVar14._8_8_ + (ulong)CARRY8(uVar20,uVar23);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar21;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((long)n + lVar27 + 0x18);
          auVar15 = auVar5 * auVar10 + auVar15;
          uVar23 = auVar15._0_8_;
          puVar1 = (ulong *)((long)puVar22 + lVar27);
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar23;
          uVar20 = auVar15._8_8_ + (ulong)CARRY8(uVar20,uVar23);
          lVar27 = lVar27 + 0x20;
        } while ((ulong)(len >> 2) << 5 != lVar27);
      }
      uVar23 = local_58;
      if ((len & 3) != 0) {
        do {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar20;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar21;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = n[uVar23];
          auVar16 = auVar6 * auVar11 + auVar16;
          uVar18 = auVar16._0_8_;
          puVar1 = puVar25 + uVar23;
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar18;
          uVar20 = auVar16._8_8_ + (ulong)CARRY8(uVar20,uVar18);
          uVar23 = uVar23 + 1;
        } while (uVar23 < uVar26);
      }
      uVar21 = (ulong)bVar28;
      uVar23 = uVar20 + c[(int)uVar24 + len];
      bVar28 = CARRY8(uVar20,c[(int)uVar24 + len]) || CARRY8(uVar23,uVar21);
      local_60[uVar24] = uVar23 + uVar21;
      uVar24 = uVar24 + 1;
      puVar22 = puVar22 + 1;
      puVar25 = puVar25 + 1;
    } while (uVar24 != uVar26);
    local_38 = (ulong)bVar28;
    local_50 = res;
  }
  local_48 = uVar26 * 8;
  uStack_70 = 0x1366f9;
  memcpy(res,c + uVar26,local_48);
  __n = local_48;
  lVar27 = -(uVar26 * 8 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&uStack_68 + lVar27);
  uVar24 = 0;
  *(undefined8 *)((long)&uStack_70 + lVar27) = 0x13671f;
  memset(__s,0,__n);
  uVar17 = (uint)local_40;
  if (3 < uVar17) {
    lVar19 = 0;
    bVar28 = false;
    do {
      uVar24 = *(ulong *)((long)res + lVar19);
      uVar21 = *(ulong *)((long)n + lVar19);
      uVar23 = uVar24 - *(ulong *)((long)n + lVar19);
      *(ulong *)((long)__s + lVar19) = uVar23 - bVar28;
      uVar20 = *(ulong *)((long)res + lVar19 + 8);
      puVar1 = (ulong *)((long)n + lVar19 + 8);
      uVar23 = (ulong)(uVar24 < uVar21 || uVar23 < bVar28);
      uVar24 = *puVar1;
      uVar18 = uVar20 - *puVar1;
      *(ulong *)((long)&local_60 + lVar19 + lVar27) = uVar18 - uVar23;
      uVar21 = *(ulong *)((long)res + lVar19 + 0x10);
      puVar1 = (ulong *)((long)n + lVar19 + 0x10);
      uVar23 = (ulong)(uVar20 < uVar24 || uVar18 < uVar23);
      uVar24 = *puVar1;
      uVar18 = uVar21 - *puVar1;
      *(ulong *)((long)&local_58 + lVar19 + lVar27) = uVar18 - uVar23;
      uVar20 = *(ulong *)((long)res + lVar19 + 0x18);
      puVar1 = (ulong *)((long)n + lVar19 + 0x18);
      uVar24 = (ulong)(uVar21 < uVar24 || uVar18 < uVar23);
      uVar21 = uVar20 - *puVar1;
      bVar28 = uVar20 < *puVar1 || uVar21 < uVar24;
      *(ulong *)((long)&local_50 + lVar19 + lVar27) = uVar21 - uVar24;
      lVar19 = lVar19 + 0x20;
    } while ((ulong)(uVar17 >> 2) << 5 != lVar19);
    uVar24 = (ulong)bVar28;
  }
  if ((local_40 & 3) != 0) {
    uVar21 = (ulong)((uint)local_40 & 0xfffffffc);
    do {
      uVar20 = (ulong)((char)uVar24 != '\0');
      uVar23 = res[uVar21] - n[uVar21];
      bVar28 = res[uVar21] < n[uVar21] || uVar23 < uVar20;
      uVar24 = (ulong)bVar28;
      *(ulong *)((long)__s + uVar21 * 8) = uVar23 - uVar20;
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar26);
    uVar24 = (ulong)bVar28;
  }
  if ((uint)local_40 != 0) {
    uVar21 = 0;
    do {
      res[uVar21] = *(ulong *)((long)__s + uVar21 * 8) & ~(local_38 - uVar24) |
                    res[uVar21] & local_38 - uVar24;
      uVar21 = uVar21 + 1;
    } while (uVar26 != uVar21);
  }
  return;
}

Assistant:

static void
bn_mont_reduction_u64(uint32_t len, uint64_t *n, uint64_t nInv, uint64_t *c, uint64_t *res)
{
  uint64_t c0 = 0ULL;
  for (uint32_t i0 = 0U; i0 < len; i0++)
  {
    uint64_t qj = nInv * c[i0];
    uint64_t *res_j0 = c + i0;
    uint64_t c1 = 0ULL;
    for (uint32_t i = 0U; i < len / 4U; i++)
    {
      uint64_t a_i = n[4U * i];
      uint64_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i0);
      uint64_t a_i0 = n[4U * i + 1U];
      uint64_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i0, qj, c1, res_i1);
      uint64_t a_i1 = n[4U * i + 2U];
      uint64_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i1, qj, c1, res_i2);
      uint64_t a_i2 = n[4U * i + 3U];
      uint64_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i2, qj, c1, res_i);
    }
    for (uint32_t i = len / 4U * 4U; i < len; i++)
    {
      uint64_t a_i = n[i];
      uint64_t *res_i = res_j0 + i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i);
    }
    uint64_t r = c1;
    uint64_t c10 = r;
    uint64_t *resb = c + len + i0;
    uint64_t res_j = c[len + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u64(c0, c10, res_j, resb);
  }
  memcpy(res, c + len, (len + len - len) * sizeof (uint64_t));
  uint64_t c00 = c0;
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint64_t));
  uint64_t c1 = 0ULL;
  for (uint32_t i = 0U; i < len / 4U; i++)
  {
    uint64_t t1 = res[4U * i];
    uint64_t t20 = n[4U * i];
    uint64_t *res_i0 = tmp + 4U * i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t1, t20, res_i0);
    uint64_t t10 = res[4U * i + 1U];
    uint64_t t21 = n[4U * i + 1U];
    uint64_t *res_i1 = tmp + 4U * i + 1U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t10, t21, res_i1);
    uint64_t t11 = res[4U * i + 2U];
    uint64_t t22 = n[4U * i + 2U];
    uint64_t *res_i2 = tmp + 4U * i + 2U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t11, t22, res_i2);
    uint64_t t12 = res[4U * i + 3U];
    uint64_t t2 = n[4U * i + 3U];
    uint64_t *res_i = tmp + 4U * i + 3U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t12, t2, res_i);
  }
  for (uint32_t i = len / 4U * 4U; i < len; i++)
  {
    uint64_t t1 = res[i];
    uint64_t t2 = n[i];
    uint64_t *res_i = tmp + i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t1, t2, res_i);
  }
  uint64_t c10 = c1;
  uint64_t c2 = c00 - c10;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t *os = res;
    uint64_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;
  }
}